

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O1

compile_errcode __thiscall FunctionCall::Action(FunctionCall *this)

{
  int line_number;
  int character_number;
  pointer pSVar1;
  bool bVar2;
  SymbolName SVar3;
  compile_errcode cVar4;
  compile_errcode unaff_EBP;
  uint uVar5;
  string identifier_name;
  vector<_SymbolType,_std::allocator<_SymbolType>_> argument_type;
  string local_88;
  vector<_SymbolType,_std::allocator<_SymbolType>_> local_68;
  string local_50;
  
  local_68.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar5 = 0;
  local_68.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  do {
    SVar3 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (uVar5 < 5) {
      pSVar1 = (handle_correct_queue->m_symbol_queue).
               super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
               _M_start;
      line_number = pSVar1[handle_correct_queue->m_current_locate].m_line_number;
      character_number = pSVar1[handle_correct_queue->m_current_locate].m_character_number;
      switch(uVar5) {
      case 0:
        if (SVar3 == IDENTIFIER_SYM) {
          c0_compile::SymbolValue::GetValue<std::__cxx11::string>
                    (&local_50,
                     &(handle_correct_queue->m_symbol_queue).
                      super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                      super__Vector_impl_data._M_start[handle_correct_queue->m_current_locate].
                      m_value);
          std::__cxx11::string::operator=((string *)&local_88,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          uVar5 = 1;
          IdentifierCheck(&local_88,line_number,character_number);
          goto LAB_00133b9a;
        }
        unaff_EBP = -1;
        uVar5 = 0;
        break;
      case 1:
        uVar5 = 2;
        if (SVar3 == L_CIRCLE_BRACKET_SYM) goto LAB_00133b9a;
        unaff_EBP = -1;
        uVar5 = 1;
        break;
      case 2:
        cVar4 = ValueArgumentList::Action(&this->m_value_argument_list,&local_68);
        if (cVar4 == 0) {
          uVar5 = 3;
          ArgumentCheck(&local_88,line_number,character_number,&local_68);
          goto LAB_00133b9a;
        }
        unaff_EBP = -1;
        uVar5 = 2;
        break;
      case 3:
        uVar5 = 4;
        if (SVar3 == R_CIRCLE_BRACKET_SYM) goto LAB_00133b9a;
        unaff_EBP = -1;
        uVar5 = 3;
        break;
      case 4:
        unaff_EBP = 0;
      }
      bVar2 = false;
    }
    else {
LAB_00133b9a:
      bVar2 = true;
      if (uVar5 != 3) {
        SymbolQueue::NextSymbol(handle_correct_queue);
      }
    }
    if (!bVar2) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if (local_68.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

compile_errcode FunctionCall::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    vector<SymbolType> argument_type;
    string identifier_name;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (name == IDENTIFIER_SYM) {
                    identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    IdentifierCheck(identifier_name, line_number, character_number);
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if ((ret = m_value_argument_list.Action(argument_type)) == COMPILE_OK) {
                    ArgumentCheck(identifier_name, line_number, character_number, argument_type);
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 4: return COMPILE_OK;
        }
        if (state != 3)
            handle_correct_queue->NextSymbol();
    }
}